

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::FieldDescriptor::has_presence(FieldDescriptor *this)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool bVar3;
  
  bVar1 = this->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    bVar1 = this->field_0x1;
    if ((bVar1 & 0x20) == 0) {
      bVar3 = true;
      if (((bVar1 & 8) == 0) && ((this->type_ & 0xfe) != 10)) {
        if (((bVar1 & 0x10) != 0) && ((this->scope_).containing_oneof == (OneofDescriptor *)0x0))
        goto LAB_00159b73;
        if ((bVar1 & 0x10) == 0) {
          bVar3 = (this->merged_features_->field_0)._impl_.field_presence_ != 2;
        }
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  has_presence();
LAB_00159b73:
  internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

bool FieldDescriptor::has_presence() const {
  if (is_repeated()) return false;
  return cpp_type() == CPPTYPE_MESSAGE || is_extension() ||
         containing_oneof() ||
         features().field_presence() != FeatureSet::IMPLICIT;
}